

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__nonblock_fcntl(int fd,int set)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  undefined4 local_18;
  int r;
  int flags;
  int set_local;
  int fd_local;
  
  do {
    local_18 = fcntl64(fd,3);
    bVar3 = false;
    if (local_18 == 0xffffffff) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (local_18 == 0xffffffff) {
    piVar2 = __errno_location();
    set_local = -*piVar2;
  }
  else if (((local_18 & 0x800) != 0) == (set != 0)) {
    set_local = 0;
  }
  else {
    if (set == 0) {
      local_18 = local_18 & 0xfffff7ff;
    }
    else {
      local_18 = local_18 | 0x800;
    }
    do {
      iVar1 = fcntl64(fd,4,local_18);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (iVar1 == 0) {
      set_local = 0;
    }
    else {
      piVar2 = __errno_location();
      set_local = -*piVar2;
    }
  }
  return set_local;
}

Assistant:

int uv__nonblock_fcntl(int fd, int set) {
  int flags;
  int r;

  do
    r = fcntl(fd, F_GETFL);
  while (r == -1 && errno == EINTR);

  if (r == -1)
    return UV__ERR(errno);

  /* Bail out now if already set/clear. */
  if (!!(r & O_NONBLOCK) == !!set)
    return 0;

  if (set)
    flags = r | O_NONBLOCK;
  else
    flags = r & ~O_NONBLOCK;

  do
    r = fcntl(fd, F_SETFL, flags);
  while (r == -1 && errno == EINTR);

  if (r)
    return UV__ERR(errno);

  return 0;
}